

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestApprovals.h
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  TestRegistry *pTVar2;
  
  ApprovalTests::initializeApprovalTestsForCppUTest();
  iVar1 = CommandLineTestRunner::RunAllTests(argc,argv);
  pTVar2 = TestRegistry::getCurrentRegistry();
  (*pTVar2->_vptr_TestRegistry[0xd])(pTVar2);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    ApprovalTests::initializeApprovalTestsForCppUTest();

    int result = CommandLineTestRunner::RunAllTests(argc, argv);
    TestRegistry::getCurrentRegistry()->resetPlugins();
    return result;
}